

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::MemberSyntax> *args_7;
  CovergroupDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_2;
  SyntaxNode *local_70;
  FunctionPortListSyntax *local_68;
  Token local_60;
  Token local_50;
  Token local_40;
  Token local_30;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_68 = (FunctionPortListSyntax *)0x0;
  }
  else {
    local_68 = (FunctionPortListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),&visitor,(BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x88) == (SyntaxNode *)0x0) {
    local_70 = (SyntaxNode *)0x0;
  }
  else {
    local_70 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x88),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  args_7 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0xa0),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xd8),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xe8) == (SyntaxNode *)0x0) {
    _visitor_2 = (SyntaxNode *)0x0;
  }
  else {
    _visitor_2 = detail::
                 visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                           (*(SyntaxNode **)(__fn + 0xe8),&visitor_2,(BumpAllocator *)__child_stack)
    ;
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CovergroupDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPortListSyntax*,slang::syntax::SyntaxNode*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     ((BumpAllocator *)__child_stack,args,&local_30,&local_40,&local_50,&local_68,
                      &local_70,(Token *)&visitor,args_7,&local_60,
                      (NamedBlockClauseSyntax **)&visitor_2);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CovergroupDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CovergroupDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.covergroup.deepClone(alloc),
        node.extends.deepClone(alloc),
        node.name.deepClone(alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr,
        node.event ? deepClone(*node.event, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.endgroup.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}